

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseElement(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  
  iVar1 = xmlParseElementStart(ctxt);
  if (iVar1 == 0) {
    xmlParseContentInternal(ctxt);
    if (ctxt->input->cur < ctxt->input->end) {
      xmlParseElementEnd(ctxt);
      return;
    }
    if (ctxt->wellFormed != 0) {
      iVar1 = ctxt->pushTab[(long)ctxt->nameNr + -1].line;
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_TAG_NOT_FINISHED,XML_ERR_FATAL,
                 ctxt->nameTab[(long)ctxt->nameNr + -1],(xmlChar *)0x0,(xmlChar *)0x0,iVar1,
                 "Premature end of data in tag %s line %d\n",ctxt->nameTab[(long)ctxt->nameNr + -1],
                 iVar1,0);
    }
  }
  return;
}

Assistant:

void
xmlParseElement(xmlParserCtxtPtr ctxt) {
    if (xmlParseElementStart(ctxt) != 0)
        return;

    xmlParseContentInternal(ctxt);

    if (ctxt->input->cur >= ctxt->input->end) {
        if (ctxt->wellFormed) {
            const xmlChar *name = ctxt->nameTab[ctxt->nameNr - 1];
            int line = ctxt->pushTab[ctxt->nameNr - 1].line;
            xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NOT_FINISHED,
                    "Premature end of data in tag %s line %d\n",
                    name, line, NULL);
        }
        return;
    }

    xmlParseElementEnd(ctxt);
}